

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreInstPrinter.c
# Opt level: O3

void XCore_printInst(MCInst *MI,SStream *O,void *Info)

{
  anon_union_1480_8_3a70395c_for_cs_detail_6 *paVar1;
  cs_detail *pcVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  int iVar6;
  char *s;
  
  uVar3 = MCInst_getOpcode(MI);
  uVar3 = *(uint *)(printInstruction_OpInfo + (ulong)uVar3 * 4);
  s = (char *)((ulong)(uVar3 & 0x7ff) + 0x38a51f);
  SStream_concat0(O,s);
  pcVar5 = strchr(s,0x5b);
  if (pcVar5 != (char *)0x0) {
    set_mem_access(MI,true,0);
  }
  switch(uVar3 >> 0xb & 3) {
  case 0:
    XCore_insn_extract(MI,s);
    return;
  case 1:
    iVar6 = 0;
    break;
  case 2:
    iVar6 = 1;
    break;
  case 3:
    iVar6 = 2;
  }
  printOperand(MI,iVar6,O);
  switch(uVar3 >> 0xd & 0x1f) {
  case 1:
    goto switchD_001c175a_caseD_1;
  case 2:
    goto switchD_001c175a_caseD_2;
  case 3:
    pcVar5 = "\n";
    goto LAB_001c1a92;
  case 4:
    SStream_concat0(O,"], ");
    if (MI->csh->detail == CS_OPT_ON) {
      MI->csh->doing_mem = false;
      paVar1 = &MI->flat_insn->detail->field_6;
      (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + '\x01';
    }
    goto LAB_001c1a9a;
  case 5:
    SStream_concat0(O,", res[");
    set_mem_access(MI,true,0);
    goto LAB_001c1a9a;
  case 6:
    SStream_concat0(O,", ps[");
    iVar6 = 0;
    goto LAB_001c1942;
  case 7:
    SStream_concat0(O,"]:cp, ");
    if (MI->csh->detail == CS_OPT_ON) {
      MI->csh->doing_mem = false;
      pcVar2 = MI->flat_insn->detail;
      pcVar2->groups[(ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x17] = '\x01';
LAB_001c1a62:
      paVar1 = &MI->flat_insn->detail->field_6;
      (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + '\x01';
    }
    break;
  case 8:
    SStream_concat0(O,"]:dp, ");
    if (MI->csh->detail == CS_OPT_ON) {
      MI->csh->doing_mem = false;
      pcVar2 = MI->flat_insn->detail;
      pcVar2->groups[(ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x17] = '\x02';
      goto LAB_001c1a62;
    }
    break;
  case 9:
    SStream_concat0(O,"]:lr, ");
    if (MI->csh->detail == CS_OPT_ON) {
      MI->csh->doing_mem = false;
      pcVar2 = MI->flat_insn->detail;
      pcVar2->groups[(ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x17] = '\x03';
      goto LAB_001c1a62;
    }
    break;
  case 10:
    SStream_concat0(O,"]:pc, ");
    if (MI->csh->detail == CS_OPT_ON) {
      MI->csh->doing_mem = false;
      pcVar2 = MI->flat_insn->detail;
      pcVar2->groups[(ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x17] = '\x11';
      goto LAB_001c1a62;
    }
    break;
  case 0xb:
    SStream_concat0(O,"]:sp, ");
    if (MI->csh->detail == CS_OPT_ON) {
      MI->csh->doing_mem = false;
      pcVar2 = MI->flat_insn->detail;
      pcVar2->groups[(ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x17] = '\x04';
      goto LAB_001c1a62;
    }
    break;
  case 0xc:
    SStream_concat0(O,", dp[");
    iVar6 = 2;
    goto LAB_001c1942;
  case 0xd:
    SStream_concat0(O,", sp[");
    iVar6 = 4;
    goto LAB_001c1942;
  case 0xe:
    SStream_concat0(O,", cp[");
    iVar6 = 1;
LAB_001c1942:
    set_mem_access(MI,true,iVar6);
    iVar6 = 1;
LAB_001c194f:
    printOperand(MI,iVar6,O);
switchD_001c175a_caseD_2:
    pcVar5 = "]";
LAB_001c195e:
    SStream_concat0(O,pcVar5);
    if (MI->csh->detail == CS_OPT_ON) {
      MI->csh->doing_mem = false;
      paVar1 = &MI->flat_insn->detail->field_6;
      (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + '\x01';
    }
switchD_001c175a_caseD_1:
    return;
  case 0xf:
    pcVar5 = "], r11";
    goto LAB_001c195e;
  case 0x10:
    SStream_concat0(O,"]:r");
    if (MI->csh->detail == CS_OPT_ON) {
      MI->csh->doing_mem = false;
      paVar1 = &MI->flat_insn->detail->field_6;
      (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + '\x01';
    }
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    iVar6 = 1;
    goto LAB_001c1a78;
  default:
    pcVar5 = ", ";
LAB_001c1a92:
    SStream_concat0(O,pcVar5);
LAB_001c1a9a:
    uVar4 = uVar3 >> 0x12 & 7;
    if (uVar4 - 2 < 2) {
      return;
    }
    if (uVar4 == 1) {
      printOperand(MI,2,O);
      switch(uVar3 >> 0x15 & 7) {
      case 0:
        goto switchD_001c1aec_caseD_0;
      case 1:
        goto switchD_001c175a_caseD_1;
      case 2:
        goto switchD_001c1aec_caseD_2;
      case 4:
        goto switchD_001c1aec_caseD_4;
      case 5:
        goto switchD_001c1aec_caseD_5;
      case 6:
        goto switchD_001c1aec_caseD_6;
      case 7:
        goto switchD_001c1aec_caseD_7;
      }
      goto switchD_001c175a_caseD_2;
    }
    if (uVar4 != 4) {
      printOperand(MI,1,O);
      switch(uVar3 >> 0x15 & 7) {
      case 0:
        goto switchD_001c1aec_caseD_0;
      case 1:
        goto switchD_001c175a_caseD_1;
      case 2:
        goto switchD_001c1aec_caseD_2;
      case 4:
        goto switchD_001c1aec_caseD_4;
      case 5:
        goto switchD_001c1aec_caseD_5;
      case 6:
        goto switchD_001c1aec_caseD_6;
      case 7:
        goto switchD_001c1aec_caseD_7;
      }
      goto switchD_001c175a_caseD_2;
    }
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    switch(uVar3 >> 0x15 & 7) {
    case 0:
switchD_001c1aec_caseD_0:
      SStream_concat0(O,", ");
      break;
    case 1:
      goto switchD_001c175a_caseD_1;
    case 2:
switchD_001c1aec_caseD_2:
      printOperand(MI,3,O);
      goto LAB_001c1c2b;
    case 3:
      goto switchD_001c175a_caseD_2;
    case 4:
switchD_001c1aec_caseD_4:
      SStream_concat0(O,"], ");
      if (MI->csh->detail == CS_OPT_ON) {
        MI->csh->doing_mem = false;
        paVar1 = &MI->flat_insn->detail->field_6;
        (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + '\x01';
      }
      iVar6 = 2;
      goto LAB_001c1a78;
    case 5:
switchD_001c1aec_caseD_5:
      printOperand(MI,2,O);
      break;
    case 6:
switchD_001c1aec_caseD_6:
      SStream_concat0(O,"[");
      iVar6 = 0xffff;
      goto LAB_001c1c59;
    case 7:
switchD_001c1aec_caseD_7:
      SStream_concat0(O,"[-");
      iVar6 = -0xffff;
LAB_001c1c59:
      set_mem_access(MI,true,iVar6);
      iVar6 = 2;
      goto LAB_001c194f;
    }
    switch(uVar3 >> 0x18 & 7) {
    case 2:
      SStream_concat0(O,", ");
      printOperand(MI,3,O);
LAB_001c1c2b:
      SStream_concat0(O,", ");
      iVar6 = 4;
      break;
    case 3:
      printOperand(MI,4,O);
      SStream_concat0(O,", ");
      switch(uVar3 >> 0x1b & 3) {
      case 0:
        goto switchD_001c175a_caseD_1;
      case 1:
        goto switchD_001c1cc8_caseD_1;
      case 2:
switchD_001c1cc8_caseD_2:
        SStream_concat0(O,", ");
        printOperand(MI,3,O);
        SStream_concat0(O,", ");
        printOperand(MI,4,O);
        SStream_concat0(O,", ");
      case 3:
switchD_001c1cc8_caseD_3:
        iVar6 = 5;
      }
      break;
    case 4:
      goto switchD_001c175a_caseD_1;
    default:
      printOperand(MI,2,O);
      switch(uVar3 >> 0x1b & 3) {
      case 0:
        goto switchD_001c175a_caseD_1;
      case 2:
        goto switchD_001c1cc8_caseD_2;
      case 3:
        goto switchD_001c1cc8_caseD_3;
      }
switchD_001c1cc8_caseD_1:
      printOperand(MI,2,O);
      SStream_concat0(O,", ");
    case 1:
      iVar6 = 3;
    }
    goto LAB_001c1a78;
  }
  iVar6 = 0;
LAB_001c1a78:
  printOperand(MI,iVar6,O);
  return;
}

Assistant:

void XCore_printInst(MCInst *MI, SStream *O, void *Info)
{
	printInstruction(MI, O, Info);
}